

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clhash.c
# Opt level: O2

uint64_t xorshift128plus(xorshift128plus_key_t *key)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = key->part1;
  uVar1 = key->part2;
  key->part1 = uVar1;
  uVar2 = uVar2 << 0x17 ^ uVar2;
  uVar2 = uVar2 >> 0x12 ^ uVar1 >> 5 ^ uVar1 ^ uVar2;
  key->part2 = uVar2;
  return uVar2 + uVar1;
}

Assistant:

uint64_t xorshift128plus(xorshift128plus_key_t * key) {
    uint64_t s1 = key->part1;
    const uint64_t s0 = key->part2;
    key->part1 = s0;
    s1 ^= s1 << 23; // a
    key->part2 = s1 ^ s0 ^ (s1 >> 18) ^ (s0 >> 5); // b, c
    return key->part2 + s0;
}